

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLDConfigLDConfigTool.cxx
# Opt level: O1

bool __thiscall
cmLDConfigLDConfigTool::GetLDConfigPaths
          (cmLDConfigLDConfigTool *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  pointer pcVar1;
  pointer pcVar2;
  cmRuntimeDependencyArchive *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  cmLDConfigLDConfigTool *pcVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  cmMakefile *this_00;
  string *psVar9;
  cmUVProcessChainBuilder *this_01;
  Status *pSVar10;
  uv_loop_t *loop;
  istream *piVar11;
  long lVar12;
  long *plVar13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmUVProcessChain process;
  string ldConfigPath;
  string line;
  cmList ldConfigCommand;
  cmUVProcessChainBuilder builder;
  RegularExpressionMatch match;
  cmUVPipeIStream output;
  undefined1 auStack_4c8 [8];
  StdioConfiguration local_4c0;
  StdioConfiguration local_4b8;
  pointer local_4b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  allocator_type local_480 [8];
  undefined8 local_478;
  char local_470;
  undefined7 uStack_46f;
  cmList local_460;
  cmLDConfigLDConfigTool *local_448;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_440;
  cmUVProcessChainBuilder local_438;
  undefined1 local_3d8 [32];
  char *local_3b8 [2];
  char local_3a8 [16];
  long *local_398 [2];
  long local_388 [23];
  char *local_2d0;
  undefined1 local_1d0 [16];
  cmBasicUVStreambuf<char,_std::char_traits<char>_> local_1c0;
  uv_handle_ptr_base_<uv_pipe_s> local_148;
  undefined8 local_138 [33];
  
  local_440 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)paths;
  this_00 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmLDConfigTool).Archive);
  pcVar1 = local_3d8 + 0x10;
  local_3d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"CMAKE_LDCONFIG_COMMAND","");
  psVar9 = cmMakefile::GetSafeDefinition(this_00,(string *)local_3d8);
  local_4c0 = (StdioConfiguration)((long)auStack_4c8 + 0x18);
  pcVar2 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(auStack_4c8 + 8),pcVar2,pcVar2 + psVar9->_M_string_length);
  if ((pointer)local_3d8._0_8_ != pcVar1) {
    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
  }
  if (local_4b8 == (StdioConfiguration)0x0) {
    local_3d8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"/sbin","");
    local_3b8[0] = local_3a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"/usr/sbin","");
    plVar13 = local_388;
    local_398[0] = plVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"/usr/local/sbin","");
    __l._M_len = 3;
    __l._M_array = (iterator)local_3d8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_438,__l,local_480);
    cmsys::SystemTools::FindProgram
              ((string *)local_1d0,"ldconfig",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_438,false);
    std::__cxx11::string::operator=((string *)(auStack_4c8 + 8),(string *)local_1d0);
    if ((cmBasicUVStreambuf<char,_std::char_traits<char>_> *)local_1d0._0_8_ != &local_1c0) {
      operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_438);
    lVar12 = -0x60;
    do {
      if (plVar13 != (long *)plVar13[-2]) {
        operator_delete((long *)plVar13[-2],*plVar13 + 1);
      }
      plVar13 = plVar13 + -4;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0);
    if (local_4b8 == (StdioConfiguration)0x0) {
      pcVar3 = (this->super_cmLDConfigTool).Archive;
      local_3d8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3d8,"Could not find ldconfig","");
      cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_3d8);
      if ((pointer)local_3d8._0_8_ != pcVar1) {
        operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
      }
      bVar6 = false;
      goto LAB_005ef0e6;
    }
  }
  local_3d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3d8,local_4c0,(undefined1 *)((long)local_4b8 + (long)local_4c0));
  init._M_len = 1;
  init._M_array = (iterator)local_3d8;
  cmList::cmList(&local_460,init);
  if ((pointer)local_3d8._0_8_ != pcVar1) {
    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_460,
             (char (*) [3])"-v");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_460,
             (char (*) [3])"-N");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_460,
             (char (*) [3])"-X");
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_438);
  this_01 = cmUVProcessChainBuilder::SetBuiltinStream(&local_438,Stream_OUTPUT);
  cmUVProcessChainBuilder::AddCommand(this_01,&local_460.Values);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)auStack_4c8);
  bVar6 = cmUVProcessChain::Valid((cmUVProcessChain *)auStack_4c8);
  if ((bVar6) &&
     (pSVar10 = cmUVProcessChain::GetStatus((cmUVProcessChain *)auStack_4c8,0),
     pSVar10->SpawnResult == 0)) {
    local_480 = (allocator_type  [8])&local_470;
    local_478._0_1_ = false;
    local_478._1_7_ = 0;
    local_470 = '\0';
    if ((GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::
         regex == '\0') &&
       (iVar8 = __cxa_guard_acquire(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::regex), iVar8 != 0)) {
      GetLDConfigPaths::regex.regmust = (char *)0x0;
      GetLDConfigPaths::regex.program = (char *)0x0;
      GetLDConfigPaths::regex.progsize = 0;
      memset(&GetLDConfigPaths::regex,0,0x20a);
      cmsys::RegularExpression::compile(&GetLDConfigPaths::regex,"^([^\t:]*):");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetLDConfigPaths::regex,
                   &__dso_handle);
      __cxa_guard_release(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::regex);
    }
    local_448 = this;
    loop = cmUVProcessChain::GetLoop((cmUVProcessChain *)auStack_4c8);
    iVar8 = cmUVProcessChain::OutputStream((cmUVProcessChain *)auStack_4c8);
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream
              ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)local_1d0,loop,iVar8);
    paVar4 = &local_4a0.field_2;
    while( true ) {
      cVar7 = std::ios::widen((char)*(pointer *)(local_1d0._0_8_ + -0x18) +
                              (char)(istream *)local_1d0);
      piVar11 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_1d0,(string *)local_480,cVar7);
      if (((&piVar11->field_0x20)[(long)piVar11->_vptr_basic_istream[-3]] & 5) != 0) break;
      memset((RegularExpressionMatch *)local_3d8,0,0x208);
      bVar6 = cmsys::RegularExpression::find
                        (&GetLDConfigPaths::regex,(char *)local_480,
                         (RegularExpressionMatch *)local_3d8);
      if (bVar6) {
        local_4a0._M_dataplus._M_p = (pointer)paVar4;
        if ((char *)local_3d8._8_8_ == (char *)0x0) {
          local_4a0._M_string_length = 0;
          local_4a0.field_2._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(auStack_4c8 + 0x28),local_3d8._8_8_,local_2d0);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_440,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (auStack_4c8 + 0x28));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != paVar4) {
          operator_delete(local_4a0._M_dataplus._M_p,
                          CONCAT71(local_4a0.field_2._M_allocated_capacity._1_7_,
                                   local_4a0.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    bVar6 = cmUVProcessChain::Wait((cmUVProcessChain *)auStack_4c8,0);
    pcVar5 = local_448;
    pcVar1 = local_3d8 + 0x10;
    if (bVar6) {
      pSVar10 = cmUVProcessChain::GetStatus((cmUVProcessChain *)auStack_4c8,0);
      if (pSVar10->ExitStatus != 0) {
        pcVar3 = (pcVar5->super_cmLDConfigTool).Archive;
        local_3d8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3d8,"Failed to run ldconfig","");
        cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_3d8);
        goto LAB_005ef33b;
      }
      bVar6 = true;
    }
    else {
      pcVar3 = (local_448->super_cmLDConfigTool).Archive;
      local_3d8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3d8,"Failed to wait on ldconfig process","");
      cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_3d8);
LAB_005ef33b:
      if ((pointer)local_3d8._0_8_ != pcVar1) {
        operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
      }
      bVar6 = false;
    }
    local_1d0._0_8_ = cmBasicUVPipeIStream<char,std::char_traits<char>>::vtable + 0x18;
    local_138[0] = 0xaac808;
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_148);
    local_1d0._0_8_ =
         cmBasicUVIStream<char,std::char_traits<char>>-in-cmBasicUVPipeIStream<char,std::char_traits<char>>
         ::construction_vtable + 0x18;
    local_138[0] = 0xaac888;
    cmBasicUVStreambuf<char,_std::char_traits<char>_>::~cmBasicUVStreambuf(&local_1c0);
    local_1d0._0_8_ =
         std::istream-in-cmBasicUVPipeIStream<char,std::char_traits<char>>::construction_vtable +
         0x18;
    local_138[0] = 0xaac8f0;
    local_1d0._8_8_ = 0;
    std::ios_base::~ios_base((ios_base *)local_138);
    if (local_480 != (allocator_type  [8])&local_470) {
      operator_delete((void *)local_480,CONCAT71(uStack_46f,local_470) + 1);
    }
  }
  else {
    pcVar3 = (this->super_cmLDConfigTool).Archive;
    local_3d8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,"Failed to start ldconfig process","");
    cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pcVar1) {
      operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
    }
    bVar6 = false;
  }
  cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)auStack_4c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.WorkingDirectory._M_dataplus._M_p != &local_438.WorkingDirectory.field_2) {
    operator_delete(local_438.WorkingDirectory._M_dataplus._M_p,
                    local_438.WorkingDirectory.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_438.Processes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_460.Values);
LAB_005ef0e6:
  if (local_4c0 != (StdioConfiguration)((long)auStack_4c8 + 0x18)) {
    operator_delete((void *)local_4c0,
                    (ulong)((long)&(local_4b0[0]->Arguments).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  return bVar6;
}

Assistant:

bool cmLDConfigLDConfigTool::GetLDConfigPaths(std::vector<std::string>& paths)
{
  std::string ldConfigPath =
    this->Archive->GetMakefile()->GetSafeDefinition("CMAKE_LDCONFIG_COMMAND");
  if (ldConfigPath.empty()) {
    ldConfigPath = cmSystemTools::FindProgram(
      "ldconfig", { "/sbin", "/usr/sbin", "/usr/local/sbin" });
    if (ldConfigPath.empty()) {
      this->Archive->SetError("Could not find ldconfig");
      return false;
    }
  }

  cmList ldConfigCommand{ ldConfigPath };
  ldConfigCommand.emplace_back("-v");
  ldConfigCommand.emplace_back("-N"); // Don't rebuild the cache.
  ldConfigCommand.emplace_back("-X"); // Don't update links.

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(ldConfigCommand);
  auto process = builder.Start();
  if (!process.Valid() || process.GetStatus(0).SpawnResult != 0) {
    this->Archive->SetError("Failed to start ldconfig process");
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression regex("^([^\t:]*):");
  cmUVPipeIStream output(process.GetLoop(), process.OutputStream());
  while (std::getline(output, line)) {
    cmsys::RegularExpressionMatch match;
    if (regex.find(line.c_str(), match)) {
      paths.push_back(match.match(1));
    }
  }

  if (!process.Wait()) {
    this->Archive->SetError("Failed to wait on ldconfig process");
    return false;
  }
  if (process.GetStatus(0).ExitStatus != 0) {
    this->Archive->SetError("Failed to run ldconfig");
    return false;
  }

  return true;
}